

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynForEach * ParseForEach(ParseContext *ctx)

{
  IntrusiveList<SynForEachIterator> iterators_00;
  bool bVar1;
  SynForEachIterator *pSVar2;
  Lexeme *pLVar3;
  Lexeme *end;
  SynBase *local_40;
  SynBase *body;
  SynForEachIterator *iterator;
  IntrusiveList<SynForEachIterator> iterators;
  Lexeme *start;
  ParseContext *ctx_local;
  
  iterators.tail = (SynForEachIterator *)ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_for);
  if (bVar1) {
    anon_unknown.dwarf_fc7e::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'for\'");
    IntrusiveList<SynForEachIterator>::IntrusiveList((IntrusiveList<SynForEachIterator> *)&iterator)
    ;
    pSVar2 = ParseForEachIterator(ctx,true);
    if (pSVar2 == (SynForEachIterator *)0x0) {
      ctx->currentLexeme = (Lexeme *)iterators.tail;
      ctx_local = (ParseContext *)0x0;
    }
    else {
      IntrusiveList<SynForEachIterator>::push_back
                ((IntrusiveList<SynForEachIterator> *)&iterator,pSVar2);
      while (bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1) {
        pSVar2 = ParseForEachIterator(ctx,false);
        if (pSVar2 == (SynForEachIterator *)0x0) {
          pLVar3 = ParseContext::Current(ctx);
          anon_unknown.dwarf_fc7e::Report
                    (ctx,pLVar3,"ERROR: variable name or type expected before \'in\'");
          break;
        }
        IntrusiveList<SynForEachIterator>::push_back
                  ((IntrusiveList<SynForEachIterator> *)&iterator,pSVar2);
      }
      anon_unknown.dwarf_fc7e::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after \'for\' statement");
      local_40 = ParseExpression(ctx);
      if (local_40 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_fc7e::Report(ctx,pLVar3,"ERROR: body not found after \'for\' header");
        local_40 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        end = ParseContext::Current(ctx);
        SynError::SynError((SynError *)local_40,pLVar3,end);
      }
      ctx_local = (ParseContext *)ParseContext::get<SynForEach>(ctx);
      pSVar2 = iterators.tail;
      pLVar3 = ParseContext::Previous(ctx);
      iterators_00.tail = iterators.head;
      iterators_00.head = iterator;
      SynForEach::SynForEach((SynForEach *)ctx_local,(Lexeme *)pSVar2,pLVar3,iterators_00,local_40);
    }
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynForEach *)ctx_local;
}

Assistant:

SynForEach* ParseForEach(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_for))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'for'");

		IntrusiveList<SynForEachIterator> iterators;

		SynForEachIterator *iterator = ParseForEachIterator(ctx, true);

		if(!iterator)
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		iterators.push_back(iterator);

		while(ctx.Consume(lex_comma))
		{
			iterator = ParseForEachIterator(ctx, false);

			if(!iterator)
			{
				Report(ctx, ctx.Current(), "ERROR: variable name or type expected before 'in'");

				break;
			}

			iterators.push_back(iterator);
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after 'for' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body)
		{
			Report(ctx, ctx.Current(), "ERROR: body not found after 'for' header");

			body = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynForEach>()) SynForEach(start, ctx.Previous(), iterators, body);
	}

	return NULL;
}